

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O3

void __thiscall boost::asio::detail::thread_group::join(thread_group *this)

{
  byte bVar1;
  pthread_t *ppVar2;
  
  ppVar2 = *(pthread_t **)this;
  while (ppVar2 != (pthread_t *)0x0) {
    bVar1 = (byte)ppVar2[1];
    if (bVar1 == 0) {
      pthread_join(*ppVar2,(void **)0x0);
      *(undefined1 *)(ppVar2 + 1) = 1;
      ppVar2 = *(pthread_t **)this;
      bVar1 = (byte)ppVar2[1];
    }
    *(pthread_t *)this = ppVar2[2];
    if ((bVar1 & 1) == 0) {
      pthread_detach(*ppVar2);
    }
    operator_delete(ppVar2,0x18);
    ppVar2 = *(pthread_t **)this;
  }
  return;
}

Assistant:

void join()
  {
    while (first_)
    {
      first_->thread_.join();
      item* tmp = first_;
      first_ = first_->next_;
      delete tmp;
    }
  }